

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O0

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_type local_30;
  size_type loc;
  string *value_local;
  string *name_local;
  string *current_local;
  
  loc = (size_type)value;
  value_local = name;
  name_local = current;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (current);
  if ((1 < sVar2) &&
     (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](name_local,0), *pvVar3 == '/')) {
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](name_local,1);
    bVar1 = valid_first_char<char>(*pvVar3);
    if (bVar1) {
      local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(name_local,':',0);
      if (local_30 == 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_90,name_local,1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value_local,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc,"");
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,name_local,1,local_30 - 1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (value_local,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_70,name_local,local_30 + 1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc,
                   &local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      return true;
    }
  }
  return false;
}

Assistant:

inline bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}